

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntBounds.cpp
# Opt level: O0

void __thiscall
IntBounds::SetBound<true>
          (IntBounds *this,ValueNumber myValueNumber,Value *baseValue,int offset,
          bool wasEstablishedExplicitly)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  ValueNumber VVar4;
  int iVar5;
  int iVar6;
  undefined4 *puVar7;
  IntBoundedValueInfo *this_00;
  IntBounds *pIVar8;
  ValueRelativeOffset *pVVar9;
  RelativeIntBoundSet *this_01;
  bool local_e1;
  ValueNumber local_d4;
  ValueRelativeOffset *local_d0;
  ValueRelativeOffset *existingBound;
  ValueRelativeOffset *local_c0;
  ValueRelativeOffset *existingOppositeBound;
  ValueRelativeOffset bound;
  ValueRelativeOffset *local_a0;
  ValueRelativeOffset *existingBound_1;
  ValueRelativeOffset *local_90;
  ValueRelativeOffset *existingOppositeBound_1;
  ValueRelativeOffset bound_1;
  EntryIterator<const_JsUtil::BaseHashSet<ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
  it;
  RelativeIntBoundSet *baseValueBoundSet;
  IntBounds *baseValueBounds;
  RelativeIntBoundSet *oppositeBoundSet;
  RelativeIntBoundSet *boundSet;
  bool isBoundConstant;
  bool success;
  ValueInfo *pVStack_30;
  int constantBoundBase;
  ValueInfo *baseValueInfo;
  bool wasEstablishedExplicitly_local;
  Value *pVStack_20;
  int offset_local;
  Value *baseValue_local;
  IntBounds *pIStack_10;
  ValueNumber myValueNumber_local;
  IntBounds *this_local;
  
  baseValueInfo._3_1_ = wasEstablishedExplicitly;
  baseValueInfo._4_4_ = offset;
  pVStack_20 = baseValue;
  baseValue_local._4_4_ = myValueNumber;
  pIStack_10 = this;
  if (baseValue == (Value *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IntBounds.cpp"
                       ,0xb0,"(baseValue)","baseValue");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  VVar4 = ::Value::GetValueNumber(pVStack_20);
  if (VVar4 == baseValue_local._4_4_) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IntBounds.cpp"
                       ,0xb1,"(baseValue->GetValueNumber() != myValueNumber)",
                       "baseValue->GetValueNumber() != myValueNumber");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  pVStack_30 = ::Value::GetValueInfo(pVStack_20);
  boundSet._4_4_ = -0x33333334;
  boundSet._3_1_ =
       ValueInfo::TryGetIntConstantLowerBound(pVStack_30,(int32 *)((long)&boundSet + 4),true);
  if (!(bool)boundSet._3_1_) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IntBounds.cpp"
                       ,0xba,"(success)","success");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  boundSet._2_1_ = ValueInfo::HasIntConstantValue(pVStack_30,false);
  local_e1 = false;
  if ((baseValueInfo._3_1_ & 1) != 0) {
    local_e1 = (bool)boundSet._2_1_;
  }
  SetBound<true>(this,boundSet._4_4_,baseValueInfo._4_4_,local_e1);
  if ((boundSet._2_1_ & 1) == 0) {
    this_01 = &this->relativeLowerBounds;
    bVar2 = ValueInfo::IsIntBounded(pVStack_30);
    if (bVar2) {
      this_00 = ValueInfo::AsIntBounded(pVStack_30);
      pIVar8 = IntBoundedValueInfo::Bounds(this_00);
      JsUtil::
      BaseHashSet<ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
      ::GetIterator((EntryIterator<const_JsUtil::BaseHashSet<ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                     *)&bound_1.offset,&pIVar8->relativeLowerBounds);
      while (bVar2 = JsUtil::
                     BaseDictionary<unsigned_int,_ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                     ::
                     EntryIterator<const_JsUtil::BaseHashSet<ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                     ::IsValid((EntryIterator<const_JsUtil::BaseHashSet<ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                                *)&bound_1.offset), bVar2) {
        pVVar9 = JsUtil::
                 BaseDictionary<unsigned_int,_ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                 ::
                 IteratorBase<const_JsUtil::BaseHashSet<ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<unsigned_int,_ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>::EntryIterator<const_JsUtil::BaseHashSet<ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>_>
                 ::CurrentValue((IteratorBase<const_JsUtil::BaseHashSet<ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<unsigned_int,_ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>::EntryIterator<const_JsUtil::BaseHashSet<ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>_>
                                 *)&bound_1.offset);
        existingOppositeBound_1 = (ValueRelativeOffset *)pVVar9->baseValue;
        bound_1.baseValue = *(Value **)&pVVar9->offset;
        VVar4 = ValueRelativeOffset::BaseValueNumber
                          ((ValueRelativeOffset *)&existingOppositeBound_1);
        if ((VVar4 != baseValue_local._4_4_) &&
           (bVar2 = ValueRelativeOffset::Add
                              ((ValueRelativeOffset *)&existingOppositeBound_1,baseValueInfo._4_4_),
           bVar2)) {
          existingBound_1._4_4_ =
               ValueRelativeOffset::BaseValueNumber((ValueRelativeOffset *)&existingOppositeBound_1)
          ;
          bVar3 = JsUtil::
                  BaseDictionary<unsigned_int,_ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                  ::TryGetReference<unsigned_int>
                            (&(this->relativeUpperBounds).
                              super_BaseDictionary<unsigned_int,_ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                             ,(uint *)((long)&existingBound_1 + 4),&local_90);
          bVar2 = false;
          if (bVar3) {
            iVar5 = ValueRelativeOffset::Offset((ValueRelativeOffset *)&existingOppositeBound_1);
            iVar6 = ValueRelativeOffset::Offset(local_90);
            bVar2 = iVar6 < iVar5;
          }
          if (!bVar2) {
            bound._12_4_ = ValueRelativeOffset::BaseValueNumber
                                     ((ValueRelativeOffset *)&existingOppositeBound_1);
            bVar2 = JsUtil::
                    BaseDictionary<unsigned_int,_ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                    ::TryGetReference<unsigned_int>
                              (&this_01->
                                super_BaseDictionary<unsigned_int,_ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                               ,(uint *)&bound.wasEstablishedExplicitly,&local_a0);
            if (bVar2) {
              ValueRelativeOffset::Merge<true,true>
                        (local_a0,(ValueRelativeOffset *)&existingOppositeBound_1);
            }
            else {
              JsUtil::
              BaseHashSet<ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
              ::Add(this_01,(ValueRelativeOffset *)&existingOppositeBound_1);
            }
          }
        }
        JsUtil::
        BaseDictionary<unsigned_int,_ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
        ::
        EntryIterator<const_JsUtil::BaseHashSet<ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
        ::MoveNext((EntryIterator<const_JsUtil::BaseHashSet<ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                    *)&bound_1.offset);
      }
    }
    ValueRelativeOffset::ValueRelativeOffset
              ((ValueRelativeOffset *)&existingOppositeBound,pVStack_20,baseValueInfo._4_4_,
               (bool)(baseValueInfo._3_1_ & 1));
    existingBound._4_4_ =
         ValueRelativeOffset::BaseValueNumber((ValueRelativeOffset *)&existingOppositeBound);
    bVar3 = JsUtil::
            BaseDictionary<unsigned_int,_ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
            ::TryGetReference<unsigned_int>
                      (&(this->relativeUpperBounds).
                        super_BaseDictionary<unsigned_int,_ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                       ,(uint *)((long)&existingBound + 4),&local_c0);
    iVar5 = baseValueInfo._4_4_;
    bVar2 = false;
    if (bVar3) {
      iVar6 = ValueRelativeOffset::Offset(local_c0);
      bVar2 = iVar6 < iVar5;
    }
    if (!bVar2) {
      local_d4 = ValueRelativeOffset::BaseValueNumber((ValueRelativeOffset *)&existingOppositeBound)
      ;
      bVar2 = JsUtil::
              BaseDictionary<unsigned_int,_ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
              ::TryGetReference<unsigned_int>
                        (&this_01->
                          super_BaseDictionary<unsigned_int,_ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                         ,&local_d4,&local_d0);
      if (bVar2) {
        ValueRelativeOffset::Merge<true,true>
                  (local_d0,(ValueRelativeOffset *)&existingOppositeBound);
      }
      else {
        JsUtil::
        BaseHashSet<ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
        ::Add(this_01,(ValueRelativeOffset *)&existingOppositeBound);
      }
    }
  }
  return;
}

Assistant:

void IntBounds::SetBound(
    const ValueNumber myValueNumber,
    const Value *const baseValue,
    const int offset,
    const bool wasEstablishedExplicitly)
{
    Assert(baseValue);
    Assert(baseValue->GetValueNumber() != myValueNumber);

    // Aggressively merge the constant lower or upper bound of the base value, adjusted by the offset
    ValueInfo const * const baseValueInfo = baseValue->GetValueInfo();
    int constantBoundBase = 0xCCCCCCCC;
    const bool success =
        Lower
            ? baseValueInfo->TryGetIntConstantLowerBound(&constantBoundBase, true)
            : baseValueInfo->TryGetIntConstantUpperBound(&constantBoundBase, true);
    Assert(success);
    const bool isBoundConstant = baseValueInfo->HasIntConstantValue();
    SetBound<Lower>(constantBoundBase, offset, wasEstablishedExplicitly && isBoundConstant);

    if(isBoundConstant)
        return;

    // If the base value has relative bounds, pull in the lower or upper bounds adjusted by the offset
    RelativeIntBoundSet &boundSet = Lower ? relativeLowerBounds : relativeUpperBounds;
    const RelativeIntBoundSet &oppositeBoundSet = Lower ? relativeUpperBounds : relativeLowerBounds;
    if(baseValueInfo->IsIntBounded())
    {
        const IntBounds *const baseValueBounds = baseValueInfo->AsIntBounded()->Bounds();
        const RelativeIntBoundSet &baseValueBoundSet =
            Lower ? baseValueBounds->relativeLowerBounds : baseValueBounds->relativeUpperBounds;
        for(auto it = baseValueBoundSet.GetIterator(); it.IsValid(); it.MoveNext())
        {
            ValueRelativeOffset bound(it.CurrentValue());
            if(bound.BaseValueNumber() == myValueNumber || !bound.Add(offset))
                continue;
            const ValueRelativeOffset *existingOppositeBound;
            if(oppositeBoundSet.TryGetReference(bound.BaseValueNumber(), &existingOppositeBound) &&
                (Lower ? bound.Offset() > existingOppositeBound->Offset() : bound.Offset() < existingOppositeBound->Offset()))
            {
                // This bound contradicts the existing opposite bound on the same base value number:
                //     - Setting a lower bound (base + offset) when (base + offset2) is an upper bound and (offset > offset2)
                //     - Setting an upper bound (base + offset) when (base + offset2) is a lower bound and (offset < offset2)
                continue;
            }
            ValueRelativeOffset *existingBound;
            if(boundSet.TryGetReference(bound.BaseValueNumber(), &existingBound))
                existingBound->Merge<Lower, true>(bound);
            else
                boundSet.Add(bound);
        }
    }

    // Set the base value as a relative bound
    const ValueRelativeOffset bound(baseValue, offset, wasEstablishedExplicitly);
    const ValueRelativeOffset *existingOppositeBound;
    if(oppositeBoundSet.TryGetReference(bound.BaseValueNumber(), &existingOppositeBound) &&
        (Lower ? offset > existingOppositeBound->Offset() : offset < existingOppositeBound->Offset()))
    {
        // This bound contradicts the existing opposite bound on the same base value number:
        //     - Setting a lower bound (base + offset) when (base + offset2) is an upper bound and (offset > offset2)
        //     - Setting an upper bound (base + offset) when (base + offset2) is a lower bound and (offset < offset2)
        return;
    }
    ValueRelativeOffset *existingBound;
    if(boundSet.TryGetReference(bound.BaseValueNumber(), &existingBound))
        existingBound->Merge<Lower, true>(bound);
    else
        boundSet.Add(bound);
}